

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_solver.cc
# Opt level: O0

void __thiscall ipx::LpSolver::RunIPM(LpSolver *this)

{
  size_t sVar1;
  Control *in_RDI;
  IPM *in_stack_00000028;
  LpSolver *in_stack_00000030;
  IPM ipm;
  IPM *in_stack_000001c8;
  LpSolver *in_stack_000001d0;
  Vector *in_stack_ffffffffffffff78;
  Vector *in_stack_ffffffffffffff80;
  Vector *in_stack_ffffffffffffff88;
  Vector *in_stack_ffffffffffffff90;
  Vector *in_stack_ffffffffffffff98;
  Control *in_stack_ffffffffffffffa0;
  LpSolver *in_stack_ffffffffffffffb0;
  string *in_stack_ffffffffffffffc8;
  Control *in_stack_ffffffffffffffd0;
  
  IPM::IPM((IPM *)&stack0xffffffffffffffa0,in_RDI);
  *(undefined4 *)&in_RDI[1].parameters_.super_ipx_parameters.ipm_feasibility_tol = 0;
  *(undefined4 *)((long)&in_RDI[1].parameters_.super_ipx_parameters.ipm_feasibility_tol + 4) = 0;
  sVar1 = std::valarray<double>::size
                    ((valarray<double> *)&in_RDI[1].dummy_.super_ostream.field_0x88);
  if (sVar1 == 0) {
    ComputeStartingPoint(in_stack_00000030,in_stack_00000028);
    if (*(int *)&in_RDI[1].parameters_.super_ipx_parameters.field_0x4 != 0) {
      return;
    }
    RunInitialIPM((LpSolver *)ipm.best_complementarity_,(IPM *)ipm._48_8_);
    if (*(int *)&in_RDI[1].parameters_.super_ipx_parameters.field_0x4 != 0) {
      return;
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff80,
               " Using starting point provided by user. Skipping initial iterations.\n",
               (allocator *)&stack0xffffffffffffff7f);
    Control::hLog(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff7f);
    std::unique_ptr<ipx::Iterate,_std::default_delete<ipx::Iterate>_>::operator->
              ((unique_ptr<ipx::Iterate,_std::default_delete<ipx::Iterate>_> *)0x83a2ec);
    Iterate::Initialize((Iterate *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                        in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                        in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                        (Vector *)in_stack_ffffffffffffffb0);
  }
  BuildStartingBasis(in_stack_ffffffffffffffb0);
  if ((*(int *)&in_RDI[1].parameters_.super_ipx_parameters.field_0x4 == 0) &&
     (*(int *)&in_RDI[1].parameters_.super_ipx_parameters.ipm_feasibility_tol == 0)) {
    RunMainIPM(in_stack_000001d0,in_stack_000001c8);
  }
  return;
}

Assistant:

void LpSolver::RunIPM() {
    IPM ipm(control_);
    info_.centring_tried = false;
    info_.centring_success = false;

    if (x_start_.size() != 0) {
      control_.hLog(" Using starting point provided by user. Skipping initial iterations.\n");
        iterate_->Initialize(x_start_, xl_start_, xu_start_,
                             y_start_, zl_start_, zu_start_);
    }
    else {
        ComputeStartingPoint(ipm);
        if (info_.status_ipm != IPX_STATUS_not_run)
            return;
        RunInitialIPM(ipm);
        if (info_.status_ipm != IPX_STATUS_not_run)
            return;
    }
    BuildStartingBasis();
    if (info_.status_ipm != IPX_STATUS_not_run || 
        info_.centring_tried)
        return;
    RunMainIPM(ipm);
}